

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O3

void __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:35:38)>_>
::~Runner(Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:35:38)>_>
          *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

bool included(const PathList& pathList, size_t depth) const {
            if (pathList.empty()) {
                return true;
            }

            for (const auto& path : pathList) {
                if (path->size() > depth) {
                    if (regex_match(name, (*path)[depth])) {
                        return true;
                    }
                }
                else {
                    return true;
                }
            }

            return false;
        }